

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFloat
          (FastFieldValuePrinter *this,float val,BaseTextGenerator *generator)

{
  uint uVar1;
  protobuf *this_00;
  bool bVar2;
  allocator local_41;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  FastFieldValuePrinter *pFStack_10;
  float val_local;
  FastFieldValuePrinter *this_local;
  
  this_00 = (protobuf *)generator;
  local_20 = generator;
  generator_local._4_4_ = val;
  pFStack_10 = this;
  uVar1 = std::isnan((double)(ulong)(uint)val);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"nan",&local_41);
  }
  else {
    SimpleFtoa_abi_cxx11_(&local_40,this_00,generator_local._4_4_);
  }
  BaseTextGenerator::PrintString(generator,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFloat(
    float val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleFtoa(val) : "nan");
}